

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ToPrimitiveFree(JSContext *ctx,JSValue val,int hint)

{
  JSValue new_target;
  int iVar1;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  JSAtom JVar4;
  uint uVar5;
  uint uVar6;
  JSAtom atom;
  JSValueUnion JVar7;
  JSRuntime *rt;
  ulong uVar8;
  ulong uVar9;
  JSRefCountHeader *p_1;
  uint uVar10;
  bool bVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSRefCountHeader *p;
  JSValueUnion local_40;
  int64_t iStack_38;
  
  uVar9 = val.tag;
  JVar7 = val.u;
  if ((int)val.tag != -1) {
    uVar9 = (ulong)JVar7.ptr >> 0x20;
    JVar12 = val;
    goto LAB_00138a29;
  }
  uVar5 = hint & 0xffffffef;
  if ((hint & 0x10U) == 0) {
    JVar12 = JS_GetPropertyInternal(ctx,val,0xc5,val,0);
    if ((int)JVar12.tag - 2U < 2) goto LAB_00138716;
    if ((int)JVar12.tag != 6) {
      JVar4 = 0x16;
      if (uVar5 == 1) {
        JVar4 = 0x46;
      }
      atom = 0x48;
      if (uVar5 != 0) {
        atom = JVar4;
      }
      _local_40 = __JS_AtomToValue(ctx,atom,1);
      JVar13 = JS_CallFree(ctx,JVar12,val,1,(JSValue *)&local_40);
      uVar8 = JVar13.tag;
      JVar2 = JVar13.u;
      if ((0xfffffff4 < local_40._8_4_) &&
         (iVar1 = *local_40.ptr, *(int *)local_40.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,_local_40);
      }
      if ((uVar8 & 0xffffffff) == 6) {
        JVar2.float64 = 0.0;
      }
      else {
        iVar1 = *JVar7.ptr;
        *(int *)JVar7.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          __JS_FreeValueRT(ctx->rt,val);
        }
        if ((int)JVar13.tag == -1) {
          JS_FreeValue(ctx,JVar13);
          JVar2.float64 = 0.0;
          JS_ThrowTypeError(ctx,"toPrimitive");
          uVar8 = 6;
          uVar9 = 0;
        }
        else {
          uVar9 = (ulong)JVar2.ptr >> 0x20;
        }
      }
      JVar12.tag = uVar8;
      JVar12.u.float64 = JVar2.float64;
      if ((int)JVar13.tag != 6) goto LAB_00138a29;
    }
  }
  else {
LAB_00138716:
    uVar10 = 0;
    do {
      bVar11 = (uVar5 != 0) != uVar10;
      JVar13 = JS_GetPropertyInternal(ctx,val,bVar11 + 0x37 + (uint)bVar11,val,0);
      JVar2 = JVar13.u;
      uVar6 = (uint)JVar13.tag;
      if (uVar6 == 6) goto LAB_001389f8;
      iVar1 = JS_IsFunction(ctx,JVar13);
      if (iVar1 == 0) {
        local_40.ptr = JVar2.ptr;
        if ((0xfffffff4 < uVar6) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2))
        {
          rt = ctx->rt;
LAB_00138855:
          __JS_FreeValueRT(rt,JVar13);
        }
      }
      else {
        local_40.ptr = (void *)(local_40 << 0x20);
        iStack_38 = 3;
        new_target.tag = 3;
        new_target.u.ptr = local_40.ptr;
        JVar12 = JS_CallInternal(ctx,JVar13,val,new_target,0,(JSValue *)0x0,2);
        JVar3 = JVar12.u;
        if ((0xfffffff4 < uVar6) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2))
        {
          __JS_FreeValueRT(ctx->rt,JVar13);
        }
        if ((int)JVar12.tag != -1) {
          if ((int)JVar12.tag == 6) goto LAB_001389f8;
          iVar1 = *JVar7.ptr;
          *(int *)JVar7.ptr = iVar1 + -1;
          if (iVar1 < 2) {
            __JS_FreeValueRT(ctx->rt,val);
          }
          uVar9 = (ulong)JVar3.ptr >> 0x20;
          goto LAB_00138a29;
        }
        iVar1 = *JVar3.ptr;
        *(int *)JVar3.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          rt = ctx->rt;
          JVar13 = JVar12;
          goto LAB_00138855;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 == 1);
    JS_ThrowTypeError(ctx,"toPrimitive");
  }
LAB_001389f8:
  iVar1 = *JVar7.ptr;
  *(int *)JVar7.ptr = iVar1 + -1;
  if (iVar1 < 2) {
    __JS_FreeValueRT(ctx->rt,val);
  }
  JVar12 = (JSValue)(ZEXT816(6) << 0x40);
LAB_00138a29:
  JVar13.u.ptr = (void *)((ulong)JVar12.u.ptr & 0xffffffff | uVar9 << 0x20);
  JVar13.tag = JVar12.tag;
  return JVar13;
}

Assistant:

static JSValue JS_ToPrimitiveFree(JSContext *ctx, JSValue val, int hint)
{
    int i;
    BOOL force_ordinary;

    JSAtom method_name;
    JSValue method, ret;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return val;
    force_ordinary = hint & HINT_FORCE_ORDINARY;
    hint &= ~HINT_FORCE_ORDINARY;
    if (!force_ordinary) {
        method = JS_GetProperty(ctx, val, JS_ATOM_Symbol_toPrimitive);
        if (JS_IsException(method))
            goto exception;
        /* ECMA says *If exoticToPrim is not undefined* but tests in
           test262 use null as a non callable converter */
        if (!JS_IsUndefined(method) && !JS_IsNull(method)) {
            JSAtom atom;
            JSValue arg;
            switch(hint) {
            case HINT_STRING:
                atom = JS_ATOM_string;
                break;
            case HINT_NUMBER:
                atom = JS_ATOM_number;
                break;
            default:
            case HINT_NONE:
                atom = JS_ATOM_default;
                break;
            }
            arg = JS_AtomToString(ctx, atom);
            ret = JS_CallFree(ctx, method, val, 1, (JSValueConst *)&arg);
            JS_FreeValue(ctx, arg);
            if (JS_IsException(ret))
                goto exception;
            JS_FreeValue(ctx, val);
            if (JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT)
                return ret;
            JS_FreeValue(ctx, ret);
            return JS_ThrowTypeError(ctx, "toPrimitive");
        }
    }
    if (hint != HINT_STRING)
        hint = HINT_NUMBER;
    for(i = 0; i < 2; i++) {
        if ((i ^ hint) == 0) {
            method_name = JS_ATOM_toString;
        } else {
            method_name = JS_ATOM_valueOf;
        }
        method = JS_GetProperty(ctx, val, method_name);
        if (JS_IsException(method))
            goto exception;
        if (JS_IsFunction(ctx, method)) {
            ret = JS_CallFree(ctx, method, val, 0, NULL);
            if (JS_IsException(ret))
                goto exception;
            if (JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT) {
                JS_FreeValue(ctx, val);
                return ret;
            }
            JS_FreeValue(ctx, ret);
        } else {
            JS_FreeValue(ctx, method);
        }
    }
    JS_ThrowTypeError(ctx, "toPrimitive");
exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}